

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O0

void __thiscall
llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::format
          (format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *this,
          iterator_range<llvm::StringRef_*> *V,raw_ostream *Stream,StringRef Style)

{
  StringRef Options;
  StringRef Str;
  StringRef Options_00;
  StringRef Style_00;
  undefined1 local_e8 [8];
  type Adapter_1;
  undefined1 local_a8 [8];
  type Adapter;
  StringRef *End;
  StringRef *Begin;
  raw_ostream *local_78;
  char *local_70;
  pair<llvm::StringRef,_llvm::StringRef> local_68;
  undefined1 auStack_48 [8];
  StringRef ArgStyle;
  StringRef Sep;
  raw_ostream *Stream_local;
  iterator_range<llvm::StringRef_*> *V_local;
  StringRef Style_local;
  
  StringRef::StringRef((StringRef *)&ArgStyle.Length);
  StringRef::StringRef((StringRef *)auStack_48);
  Style_00.Length = (size_t)Style.Data;
  Style_00.Data = (char *)Stream;
  local_78 = Stream;
  local_70 = Style.Data;
  parseOptions(&local_68,Style_00);
  std::tie<llvm::StringRef,llvm::StringRef>((StringRef *)&Begin,(StringRef *)&ArgStyle.Length);
  std::tuple<llvm::StringRef&,llvm::StringRef&>::operator=
            ((tuple<llvm::StringRef&,llvm::StringRef&> *)&Begin,&local_68);
  End = iterator_range<llvm::StringRef_*>::begin((iterator_range<llvm::StringRef_*> *)this);
  Adapter.Item = iterator_range<llvm::StringRef_*>::end((iterator_range<llvm::StringRef_*> *)this);
  if (End != Adapter.Item) {
    detail::build_format_adapter<llvm::StringRef&>((detail *)local_a8,End);
    Options_00.Length = (size_t)ArgStyle.Data;
    Options_00.Data = (char *)auStack_48;
    detail::provider_format_adapter<llvm::StringRef_&>::format
              ((provider_format_adapter<llvm::StringRef_&> *)local_a8,(raw_ostream *)V,Options_00);
    End = End + 1;
    detail::provider_format_adapter<llvm::StringRef_&>::~provider_format_adapter
              ((provider_format_adapter<llvm::StringRef_&> *)local_a8);
  }
  while (End != Adapter.Item) {
    Adapter_1.Item = (StringRef *)ArgStyle.Length;
    Str.Length = (size_t)Sep.Data;
    Str.Data = (char *)ArgStyle.Length;
    raw_ostream::operator<<((raw_ostream *)V,Str);
    detail::build_format_adapter<llvm::StringRef&>((detail *)local_e8,End);
    Options.Length = (size_t)ArgStyle.Data;
    Options.Data = (char *)auStack_48;
    detail::provider_format_adapter<llvm::StringRef_&>::format
              ((provider_format_adapter<llvm::StringRef_&> *)local_e8,(raw_ostream *)V,Options);
    End = End + 1;
    detail::provider_format_adapter<llvm::StringRef_&>::~provider_format_adapter
              ((provider_format_adapter<llvm::StringRef_&> *)local_e8);
  }
  return;
}

Assistant:

static void format(const llvm::iterator_range<IterT> &V,
                     llvm::raw_ostream &Stream, StringRef Style) {
    StringRef Sep;
    StringRef ArgStyle;
    std::tie(Sep, ArgStyle) = parseOptions(Style);
    auto Begin = V.begin();
    auto End = V.end();
    if (Begin != End) {
      auto Adapter =
          detail::build_format_adapter(std::forward<reference>(*Begin));
      Adapter.format(Stream, ArgStyle);
      ++Begin;
    }
    while (Begin != End) {
      Stream << Sep;
      auto Adapter =
          detail::build_format_adapter(std::forward<reference>(*Begin));
      Adapter.format(Stream, ArgStyle);
      ++Begin;
    }
  }